

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O1

void nni_http_get_body(nng_http *conn,void **datap,size_t *sizep)

{
  nng_http_req *pnVar1;
  bool bVar2;
  
  bVar2 = conn->client != false;
  pnVar1 = &conn->req;
  if (bVar2) {
    pnVar1 = (nng_http_req *)&conn->res;
  }
  *datap = (pnVar1->data).data;
  pnVar1 = (nng_http_req *)&conn->res;
  if (!bVar2) {
    pnVar1 = &conn->req;
  }
  *sizep = (pnVar1->data).size;
  return;
}

Assistant:

void
nni_http_get_body(nng_http *conn, void **datap, size_t *sizep)
{
	if (conn->client) {
		*datap = conn->res.data.data;
		*sizep = conn->res.data.size;
	} else {
		*datap = conn->req.data.data;
		*sizep = conn->req.data.size;
	}
}